

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int mbedtls_base64_encode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  ulong uVar5;
  uchar *puVar6;
  uint uVar7;
  
  if (slen == 0) {
    *olen = 0;
    return 0;
  }
  uVar5 = (slen / 3 + 1) - (ulong)(slen % 3 == 0);
  if (uVar5 >> 0x3e == 0) {
    uVar5 = uVar5 * 4;
    if ((dst != (uchar *)0x0) && (uVar5 < dlen)) {
      puVar6 = dst;
      for (uVar5 = 1; uVar5 - 1 < (slen / 3) * 3; uVar5 = uVar5 + 3) {
        bVar1 = src[uVar5 - 1];
        bVar2 = src[uVar5];
        bVar3 = src[uVar5 + 1];
        uVar4 = mbedtls_ct_base64_enc_char(bVar1 >> 2);
        *puVar6 = uVar4;
        uVar4 = mbedtls_ct_base64_enc_char((bVar1 & 3) << 4 | bVar2 >> 4);
        puVar6[1] = uVar4;
        uVar4 = mbedtls_ct_base64_enc_char(bVar3 >> 6 | (bVar2 & 0xf) << 2);
        puVar6[2] = uVar4;
        uVar4 = mbedtls_ct_base64_enc_char(bVar3 & 0x3f);
        puVar6[3] = uVar4;
        puVar6 = puVar6 + 4;
      }
      if (uVar5 - 1 < slen) {
        bVar1 = src[uVar5 - 1];
        uVar7 = 0;
        if (uVar5 < slen) {
          uVar7 = (uint)src[uVar5];
        }
        uVar4 = mbedtls_ct_base64_enc_char(bVar1 >> 2);
        *puVar6 = uVar4;
        uVar4 = mbedtls_ct_base64_enc_char((byte)(uVar7 >> 4) | (bVar1 & 3) << 4);
        puVar6[1] = uVar4;
        uVar4 = '=';
        if (uVar5 < slen) {
          uVar4 = mbedtls_ct_base64_enc_char(((byte)uVar7 & 0xf) << 2);
        }
        puVar6[2] = uVar4;
        puVar6[3] = '=';
        puVar6 = puVar6 + 4;
      }
      *olen = (long)puVar6 - (long)dst;
      *puVar6 = '\0';
      return 0;
    }
    *olen = uVar5 | 1;
  }
  else {
    *olen = 0xffffffffffffffff;
  }
  return -0x2a;
}

Assistant:

int mbedtls_base64_encode(unsigned char *dst, size_t dlen, size_t *olen,
                          const unsigned char *src, size_t slen)
{
    size_t i, n;
    int C1, C2, C3;
    unsigned char *p;

    if (slen == 0) {
        *olen = 0;
        return 0;
    }

    n = slen / 3 + (slen % 3 != 0);

    if (n > (SIZE_MAX - 1) / 4) {
        *olen = SIZE_MAX;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    n *= 4;

    if ((dlen < n + 1) || (NULL == dst)) {
        *olen = n + 1;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    n = (slen / 3) * 3;

    for (i = 0, p = dst; i < n; i += 3) {
        C1 = *src++;
        C2 = *src++;
        C3 = *src++;

        *p++ = mbedtls_ct_base64_enc_char((C1 >> 2) & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char((((C1 &  3) << 4) + (C2 >> 4))
                                          & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char((((C2 & 15) << 2) + (C3 >> 6))
                                          & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char(C3 & 0x3F);
    }

    if (i < slen) {
        C1 = *src++;
        C2 = ((i + 1) < slen) ? *src++ : 0;

        *p++ = mbedtls_ct_base64_enc_char((C1 >> 2) & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char((((C1 & 3) << 4) + (C2 >> 4))
                                          & 0x3F);

        if ((i + 1) < slen) {
            *p++ = mbedtls_ct_base64_enc_char(((C2 & 15) << 2) & 0x3F);
        } else {
            *p++ = '=';
        }

        *p++ = '=';
    }

    *olen = p - dst;
    *p = 0;

    return 0;
}